

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O2

BigNumber * __thiscall
BigNumber::subtractstr(BigNumber *__return_storage_ptr__,BigNumber *this,string *other)

{
  BigNumber BStack_58;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)other);
  std::__cxx11::string::string((string *)&BStack_58,local_38);
  subtract(__return_storage_ptr__,this,&BStack_58);
  std::__cxx11::string::~string((string *)&BStack_58);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::subtractstr(const std::string &other) {
    return this->subtract(BigNumber(other));
}